

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cpp
# Opt level: O1

ssize_t chatter::platform::SocketSendTo(Socket socket,void *buf,size_t buf_len,HostAddress *address)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  sockaddr_in dest;
  sockaddr local_38;
  
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_family = 2;
  local_38.sa_data[0] = '\0';
  local_38.sa_data[1] = '\0';
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  uVar1 = HostAddress::port(address);
  local_38.sa_data._0_2_ = uVar1 << 8 | uVar1 >> 8;
  uVar2 = HostAddress::address(address);
  local_38.sa_data._2_4_ = uVar2;
  sVar3 = sendto(socket,buf,buf_len,0,&local_38,0x10);
  return sVar3;
}

Assistant:

ssize_t SocketSendTo(Socket socket, const void *buf, size_t buf_len, const HostAddress& address)
{
    struct sockaddr_in dest = {0};
    dest.sin_family = AF_INET;
    dest.sin_port = HostToNet16(address.port());
    dest.sin_addr.s_addr = address.address();
    return sendto((int)socket, buf, buf_len, 0, (struct sockaddr*)&dest, sizeof(dest));
}